

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall
cmake::AppendExtraGeneratorsDocumentation
          (cmake *this,vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *v)

{
  cmExternalMakefileProjectGeneratorFactory *this_00;
  pointer pbVar1;
  pointer pbVar2;
  cmDocumentationEntry e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generators;
  string doc;
  string name;
  undefined1 local_108 [32];
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  char local_c8;
  pointer local_c0;
  pointer local_b8;
  cmExternalMakefileProjectGeneratorFactory *local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  local_c0 = (this->ExtraGenerators).
             super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (local_b8 = (this->ExtraGenerators).
                  super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; local_b8 != local_c0;
      local_b8 = local_b8 + 1) {
    this_00 = *local_b8;
    cmExternalMakefileProjectGeneratorFactory::GetDocumentation_abi_cxx11_(&local_90,this_00);
    cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_70,this_00);
    pbVar2 = (this_00->Aliases).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_b0 = this_00;
    for (pbVar1 = (this_00->Aliases).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar1 != pbVar2; pbVar1 = pbVar1 + 1)
    {
      local_108._0_8_ = local_108 + 0x10;
      local_108._8_8_ = 0;
      local_108[0x10] = '\0';
      local_e8._M_p = (pointer)&local_d8;
      local_e0 = 0;
      local_d8._M_local_buf[0] = '\0';
      local_c8 = ' ';
      std::__cxx11::string::_M_assign((string *)local_108);
      std::__cxx11::string::_M_assign((string *)&local_e8);
      std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::
      emplace_back<cmDocumentationEntry>(v,(cmDocumentationEntry *)local_108);
      cmDocumentationEntry::~cmDocumentationEntry((cmDocumentationEntry *)local_108);
    }
    cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
              (&local_a8,local_b0);
    pbVar1 = local_a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar2 = local_a8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1)
    {
      local_108._0_8_ = local_108 + 0x10;
      local_108._8_8_ = 0;
      local_108[0x10] = '\0';
      local_e8._M_p = (pointer)&local_d8;
      local_e0 = 0;
      local_d8._M_local_buf[0] = '\0';
      local_c8 = ' ';
      cmExternalMakefileProjectGenerator::CreateFullGeneratorName(&local_50,pbVar2,&local_70);
      std::__cxx11::string::operator=((string *)local_108,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::_M_assign((string *)&local_e8);
      std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::
      emplace_back<cmDocumentationEntry>(v,(cmDocumentationEntry *)local_108);
      cmDocumentationEntry::~cmDocumentationEntry((cmDocumentationEntry *)local_108);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

void cmake::AppendExtraGeneratorsDocumentation(
  std::vector<cmDocumentationEntry>& v)
{
  for (cmExternalMakefileProjectGeneratorFactory* eg : this->ExtraGenerators) {
    const std::string doc = eg->GetDocumentation();
    const std::string name = eg->GetName();

    // Aliases:
    for (std::string const& a : eg->Aliases) {
      cmDocumentationEntry e;
      e.Name = a;
      e.Brief = doc;
      v.push_back(std::move(e));
    }

    // Full names:
    const std::vector<std::string> generators =
      eg->GetSupportedGlobalGenerators();
    for (std::string const& g : generators) {
      cmDocumentationEntry e;
      e.Name =
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName(g, name);
      e.Brief = doc;
      v.push_back(std::move(e));
    }
  }
}